

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::anon_unknown_12::doParseModule
          (Result<wasm::Ok> *__return_storage_ptr__,Module *wasm,Lexer *input,bool allowExtra)

{
  undefined8 *puVar1;
  size_type *psVar2;
  size_type *psVar3;
  size_type *psVar4;
  undefined **ppuVar5;
  size_type *psVar6;
  uint uVar7;
  _Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
  *p_Var8;
  pointer pDVar9;
  Lexer *input_00;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>,_bool>
  pVar10;
  undefined1 local_440 [8];
  ParseDeclsCtx decls;
  _Alloc_hider local_258 [2];
  string local_248;
  undefined1 local_228 [8];
  Result<wasm::Ok> _val;
  undefined *puStack_1f8;
  int local_1f0;
  undefined1 auStack_1ec [21];
  undefined3 uStack_1d7;
  undefined5 uStack_1d4;
  bool local_1c0;
  bool local_1b8;
  __node_base_ptr *local_1b0;
  size_type local_1a8;
  __node_base local_1a0;
  size_type sStack_198;
  float local_190;
  size_t local_188;
  __node_base_ptr p_Stack_180;
  __node_base_ptr *local_178;
  size_type local_170;
  __node_base local_168;
  size_type sStack_160;
  float local_158;
  size_t local_150;
  __node_base_ptr p_Stack_148;
  undefined2 local_140;
  undefined1 local_138 [8];
  Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
  typeIndices;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
  implicitTypes;
  undefined1 auStack_98 [8];
  unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
  typeNames;
  undefined1 local_58 [8];
  size_type __dnew;
  undefined1 local_48 [16];
  bool local_38;
  
  ParseDeclsCtx::ParseDeclsCtx((ParseDeclsCtx *)local_440,input,wasm);
  parseDecls((Result<wasm::Ok> *)local_228,(ParseDeclsCtx *)local_440);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    psVar2 = (size_type *)
             ((long)&typeIndices.val.
                     super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
             + 8);
    local_138 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_138,local_228,
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_228);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if (local_138 == (undefined1  [8])psVar2) {
      *puVar1 = typeIndices.val.
                super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
                super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
                super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
                super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
                super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                ._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           typeIndices.val.
           super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
           .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           _M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_138;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           typeIndices.val.
           super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
           .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           _M_u._8_8_;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         typeIndices.val.
         super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
         .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
         super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
         super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
         super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
         super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u.
         _0_8_;
    typeIndices.val.
    super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
    .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u._0_8_
         = 0;
    typeIndices.val.
    super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
    .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u._8_8_
         = typeIndices.val.
           super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
           .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
           _M_u._8_8_ & 0xffffffffffffff00;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    local_138 = (undefined1  [8])psVar2;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_228);
    goto LAB_00c35027;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_228);
  if ((!allowExtra) &&
     (local_440 !=
      (undefined1  [8])
      decls.in.file.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._32_8_)) {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"Unexpected tokens after module","");
    Lexer::err((Err *)local_228,(Lexer *)local_440,&local_248);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    ppuVar5 = (undefined **)
              ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
    if (local_228 == (undefined1  [8])ppuVar5) {
      *puVar1 = _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_228;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_u._0_8_ = 0;
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _M_u._8_8_ = _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ & 0xffffffffffffff00;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    local_228 = (undefined1  [8])ppuVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00c35027;
  }
  local_228 = (undefined1  [8])&puStack_1f8;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = 1;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._8_8_ = 0;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._16_8_ = 0;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._24_4_ = 0x3f800000;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _M_index = '\0';
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _33_7_ = 0;
  puStack_1f8._0_1_ = '\0';
  puStack_1f8._1_2_ = 0;
  puStack_1f8._3_1_ = '\0';
  puStack_1f8._4_4_ = 0;
  implicitTypes._M_h._M_single_bucket = (__node_base_ptr)input;
  if (decls.recTypeDefs.
      super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      decls.typeDefs.
      super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pDVar9 = decls.recTypeDefs.
             super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      if ((pDVar9->name).super_IString.str._M_str != (char *)0x0) {
        auStack_98 = (undefined1  [8])(pDVar9->name).super_IString.str._M_len;
        typeNames._M_h._M_buckets = (__buckets_ptr)(pDVar9->name).super_IString.str._M_str;
        typeNames._M_h._M_bucket_count =
             CONCAT44(typeNames._M_h._M_bucket_count._4_4_,pDVar9->index);
        pVar10 = std::
                 _Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<wasm::Name_const,unsigned_int>>
                           ((_Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)local_228,auStack_98);
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          uVar7 = pDVar9->pos;
          psVar6 = &implicitTypes._M_h._M_bucket_count;
          local_58 = (undefined1  [8])0x16;
          types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)psVar6;
          types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::__cxx11::string::_M_create
                                  ((ulong *)&types.
                                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (ulong)local_58);
          implicitTypes._M_h._M_bucket_count = (size_type)local_58;
          (types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage)->id = 0x746163696c707564;
          types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[1].id = 0x6e656d656c652065;
          *(undefined8 *)
           ((long)&types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage[1].id + 6) = 0x656d616e20746e65;
          implicitTypes._M_h._M_buckets = (__buckets_ptr)local_58;
          *(char *)((long)&(types.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage)->id + (long)local_58)
               = '\0';
          Lexer::err((Err *)auStack_98,(Lexer *)local_440,(ulong)uVar7,
                     (string *)
                     &types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          input_00 = (Lexer *)implicitTypes._M_h._M_single_bucket;
          local_138 = (undefined1  [8])
                      ((long)&typeIndices.val.
                              super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                      + 8);
          psVar2 = &typeNames._M_h._M_bucket_count;
          if (auStack_98 == (undefined1  [8])psVar2) {
            typeIndices.val.
            super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
            .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            _M_u._16_8_ = typeNames._M_h._M_before_begin._M_nxt;
          }
          else {
            local_138 = auStack_98;
          }
          typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u
          ._8_8_ = typeNames._M_h._M_bucket_count;
          typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u
          ._0_8_ = typeNames._M_h._M_buckets;
          typeNames._M_h._M_buckets = (__buckets_ptr)0x0;
          typeNames._M_h._M_bucket_count = typeNames._M_h._M_bucket_count & 0xffffffffffffff00;
          typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u
          ._M_first._M_storage._M_storage[0x30] = '\x01';
          auStack_98 = (undefined1  [8])psVar2;
          if (types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)psVar6) {
            operator_delete(types.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            implicitTypes._M_h._M_bucket_count + 1);
          }
          goto LAB_00c34a58;
        }
      }
      pDVar9 = pDVar9 + 1;
    } while (pDVar9 != decls.typeDefs.
                       super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)local_138,local_228);
  typeIndices.val.
  super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
  .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
  super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
  super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
  super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
  super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u.
  _M_first._M_storage._M_storage[0x30] = '\0';
  input_00 = (Lexer *)implicitTypes._M_h._M_single_bucket;
LAB_00c34a58:
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_228);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                     *)local_228,
                    (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                     *)local_138);
  if ((__index_type)local_1f0 == '\x01') {
    psVar2 = &typeNames._M_h._M_bucket_count;
    auStack_98 = (undefined1  [8])psVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_98,local_228,
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_228);
    psVar3 = (size_type *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(size_type **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = psVar3;
    if (auStack_98 == (undefined1  [8])psVar2) {
      *psVar3 = typeNames._M_h._M_bucket_count;
      *(_Hash_node_base **)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           typeNames._M_h._M_before_begin._M_nxt;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = auStack_98;
      *(size_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           typeNames._M_h._M_bucket_count;
    }
    *(__buckets_ptr *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = typeNames._M_h._M_buckets;
    typeNames._M_h._M_buckets = (__buckets_ptr)0x0;
    typeNames._M_h._M_bucket_count = typeNames._M_h._M_bucket_count & 0xffffffffffffff00;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    auStack_98 = (undefined1  [8])psVar2;
    std::__detail::__variant::
    _Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         *)local_228);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         *)local_228);
    typeIndices.val.
    super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
    .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_index =
         '\0';
    typeIndices.val.
    super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
    .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
    super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._57_7_ = 0
    ;
    types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_98 = (undefined1  [8])&typeNames._M_h._M_rehash_policy._M_next_resize;
    typeNames._M_h._M_buckets = (__buckets_ptr)0x1;
    typeNames._M_h._M_bucket_count = 0;
    typeNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    typeNames._M_h._M_element_count._0_4_ = 0x3f800000;
    typeNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    typeNames._M_h._M_rehash_policy._4_4_ = 0;
    typeNames._M_h._M_rehash_policy._M_next_resize = 0;
    p_Var8 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
              *)0x0;
    if (typeIndices.val.
        super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
        .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u.
        _M_first._M_storage._M_storage[0x30] == '\0') {
      p_Var8 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                *)local_138;
    }
    parseTypeDefs((Result<wasm::Ok> *)local_228,(ParseDeclsCtx *)local_440,input_00,
                  (IndexMap *)p_Var8,
                  (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                  ((long)&typeIndices.val.
                          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                  + 0x38),(unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                           *)auStack_98);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      psVar4 = &implicitTypes._M_h._M_bucket_count;
      types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)psVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 &types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_228,
                 _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_228);
      psVar6 = (size_type *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(size_type **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = psVar6;
      if (types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)psVar4) {
        *psVar6 = implicitTypes._M_h._M_bucket_count;
        *(_Hash_node_base **)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             implicitTypes._M_h._M_before_begin._M_nxt;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             implicitTypes._M_h._M_bucket_count;
      }
      *(__buckets_ptr *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
           implicitTypes._M_h._M_buckets;
      implicitTypes._M_h._M_buckets = (__buckets_ptr)0x0;
      implicitTypes._M_h._M_bucket_count = implicitTypes._M_h._M_bucket_count & 0xffffffffffffff00;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)psVar4;
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_228);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_228);
      types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)&implicitTypes._M_h._M_rehash_policy._M_next_resize;
      implicitTypes._M_h._M_buckets = (__buckets_ptr)0x1;
      implicitTypes._M_h._M_bucket_count = 0;
      implicitTypes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      implicitTypes._M_h._M_element_count._0_4_ = 0x3f800000;
      implicitTypes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      implicitTypes._M_h._M_rehash_policy._4_4_ = 0;
      implicitTypes._M_h._M_rehash_policy._M_next_resize = 0;
      p_Var8 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                *)0x0;
      if (typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u
          ._M_first._M_storage._M_storage[0x30] == '\0') {
        p_Var8 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                  *)local_138;
      }
      parseImplicitTypeDefs
                ((Result<wasm::Ok> *)local_228,(ParseDeclsCtx *)local_440,input_00,
                 (IndexMap *)p_Var8,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 ((long)&typeIndices.val.
                         super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                 + 0x38),(unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                          *)&types.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_58 = (undefined1  [8])local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,local_228,
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_228);
LAB_00c34f9c:
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if (local_58 == (undefined1  [8])local_48) {
          *puVar1 = CONCAT71(local_48._1_7_,local_48[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = local_48._8_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_58;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(local_48._1_7_,local_48[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = __dnew;
        __dnew = 0;
        local_48[0] = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        local_58 = (undefined1  [8])local_48;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_228);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_228);
        p_Var8 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                  *)0x0;
        if (typeIndices.val.
            super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
            .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            _M_u._M_first._M_storage._M_storage[0x30] == '\0') {
          p_Var8 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                    *)local_138;
        }
        parseModuleTypes((Result<wasm::Ok> *)local_228,(ParseDeclsCtx *)local_440,input_00,
                         (IndexMap *)p_Var8,
                         (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         ((long)&typeIndices.val.
                                 super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         + 0x38),(unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                                  *)&types.
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          local_58 = (undefined1  [8])local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,local_228,
                     _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_228)
          ;
          goto LAB_00c34f9c;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_228);
        p_Var8 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                  *)0x0;
        if (typeIndices.val.
            super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
            .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            _M_u._M_first._M_storage._M_storage[0x30] == '\0') {
          p_Var8 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                    *)local_138;
        }
        parseDefinitions((Result<wasm::Ok> *)local_228,(ParseDeclsCtx *)local_440,input_00,
                         (IndexMap *)p_Var8,
                         (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         ((long)&typeIndices.val.
                                 super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         + 0x38),(unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                                  *)&types.
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                          *)auStack_98);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          local_58 = (undefined1  [8])local_48;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_58,local_228,
                     _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_228)
          ;
          goto LAB_00c34f9c;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_228);
        local_228 = (undefined1  [8])&PTR__PassRunner_01091270;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_8_ = &wasm->allocator;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_4_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._28_4_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\0';
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._33_7_ = 0;
        puStack_1f8._0_1_ = '\0';
        puStack_1f8._1_2_ = 0x101;
        puStack_1f8._4_4_ = 0;
        local_1f0 = 0;
        auStack_1ec._0_4_ = 2;
        auStack_1ec._4_4_ = 0xffffffff;
        auStack_1ec._8_4_ = 0x14;
        auStack_1ec[0xc] = false;
        local_1c0 = false;
        local_1b8 = false;
        local_1b0 = &p_Stack_180;
        auStack_1ec._16_4_ = 0;
        auStack_1ec[0x14] = false;
        uStack_1d7._0_1_ = false;
        uStack_1d7._1_1_ = false;
        uStack_1d7._2_1_ = false;
        uStack_1d4._0_1_ = false;
        uStack_1d4._1_1_ = false;
        uStack_1d4._2_1_ = false;
        uStack_1d4._3_1_ = false;
        uStack_1d4._4_1_ = false;
        local_1a8 = 1;
        local_1a0._M_nxt = (_Hash_node_base *)0x0;
        sStack_198 = 0;
        local_190 = 1.0;
        local_188 = 0;
        p_Stack_180 = (__node_base_ptr)0x0;
        local_178 = &p_Stack_148;
        local_170 = 1;
        local_168._M_nxt = (_Hash_node_base *)0x0;
        sStack_160 = 0;
        local_158 = 1.0;
        local_150 = 0;
        p_Stack_148 = (__node_base_ptr)0x0;
        local_140._0_1_ = false;
        local_140._1_1_ = false;
        local_58 = (undefined1  [8])0x14;
        decls._464_8_ = local_258;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = wasm;
        decls._464_8_ = std::__cxx11::string::_M_create((ulong *)&decls.tagCounter,(ulong)local_58);
        local_258[0]._M_p = (pointer)local_58;
        builtin_strncpy((char *)decls._464_8_,"propagate-debug-locs",0x14);
        *(char *)(decls._464_8_ + (long)local_58) = '\0';
        local_38 = false;
        PassRunner::add((PassRunner *)local_228,(string *)&decls.tagCounter,
                        (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_58);
        if (local_38 == true) {
          local_38 = false;
          if (local_58 != (undefined1  [8])local_48) {
            operator_delete((void *)local_58,CONCAT71(local_48._1_7_,local_48[0]) + 1);
          }
        }
        if ((_Alloc_hider *)decls._464_8_ != local_258) {
          operator_delete((void *)decls._464_8_,(ulong)(local_258[0]._M_p + 1));
        }
        local_140._0_1_ = true;
        PassRunner::run((PassRunner *)local_228);
        PassRunner::~PassRunner((PassRunner *)local_228);
        input_00->pos = (size_t)local_440;
        std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
        operator=(&input_00->annotations,
                  (vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                   *)&decls);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_copy_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&input_00->file,
                         (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&decls.in.annotations.
                             super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        (input_00->buffer)._M_len =
             decls.in.file.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._32_8_;
        (input_00->buffer)._M_str = (char *)decls.in.buffer._M_len;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::HeapType>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::HeapType>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)auStack_98);
    if (typeIndices.val.
        super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
        .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._56_8_
        != 0) {
      operator_delete((void *)typeIndices.val.
                              super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                              .
                              super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                              ._56_8_,
                      (long)types.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      typeIndices.val.
                      super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                      ._56_8_);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                       *)local_138);
LAB_00c35027:
  ParseDeclsCtx::~ParseDeclsCtx((ParseDeclsCtx *)local_440);
  return __return_storage_ptr__;
}

Assistant:

Result<> doParseModule(Module& wasm, Lexer& input, bool allowExtra) {
  ParseDeclsCtx decls(input, wasm);
  CHECK_ERR(parseDecls(decls));
  if (!allowExtra && !decls.in.empty()) {
    return decls.in.err("Unexpected tokens after module");
  }

  auto typeIndices = createIndexMap(decls.in, decls.typeDefs);
  CHECK_ERR(typeIndices);

  std::vector<HeapType> types;
  std::unordered_map<HeapType, std::unordered_map<Name, Index>> typeNames;
  CHECK_ERR(parseTypeDefs(decls, input, *typeIndices, types, typeNames));

  std::unordered_map<Index, HeapType> implicitTypes;
  CHECK_ERR(
    parseImplicitTypeDefs(decls, input, *typeIndices, types, implicitTypes));

  CHECK_ERR(parseModuleTypes(decls, input, *typeIndices, types, implicitTypes));

  CHECK_ERR(parseDefinitions(
    decls, input, *typeIndices, types, implicitTypes, typeNames));

  propagateDebugLocations(wasm);
  input = decls.in;

  return Ok{};
}